

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeitem.cpp
# Opt level: O0

int __thiscall TreeItem::row(TreeItem *this)

{
  size_type sVar1;
  reference ppTVar2;
  int local_2c;
  iterator iStack_28;
  int i;
  _List_const_iterator<TreeItem_*> local_20;
  const_iterator iter;
  TreeItem *this_local;
  
  if (this->parentItem != (TreeItem *)0x0) {
    iter._M_node = (_List_node_base *)this;
    iStack_28 = std::__cxx11::list<TreeItem_*,_std::allocator<TreeItem_*>_>::begin
                          (&this->parentItem->childItems);
    std::_List_const_iterator<TreeItem_*>::_List_const_iterator(&local_20,&stack0xffffffffffffffd8);
    local_2c = 0;
    while (sVar1 = std::__cxx11::list<TreeItem_*,_std::allocator<TreeItem_*>_>::size
                             (&this->parentItem->childItems), local_2c < (int)sVar1) {
      ppTVar2 = std::_List_const_iterator<TreeItem_*>::operator*(&local_20);
      if (this == *ppTVar2) {
        return local_2c;
      }
      local_2c = local_2c + 1;
      std::_List_const_iterator<TreeItem_*>::operator++(&local_20);
    }
  }
  return 0;
}

Assistant:

int TreeItem::row() const
{
    if (parentItem) {
        std::list<TreeItem*>::const_iterator iter = parentItem->childItems.begin();
        for (int i = 0; i < (int)parentItem->childItems.size(); ++i, ++iter) {
            if (const_cast<TreeItem*>(this) == *iter)
                return i;
        }
    }
    return 0;
}